

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

bool __thiscall
crnlib::vector<unsigned_int>::operator==(vector<unsigned_int> *this,vector<unsigned_int> *rhs)

{
  int iVar1;
  vector<unsigned_int> *rhs_local;
  vector<unsigned_int> *this_local;
  
  if (this->m_size == rhs->m_size) {
    if (this->m_size == 0) {
      this_local._7_1_ = true;
    }
    else {
      iVar1 = memcmp(this->m_p,rhs->m_p,(ulong)this->m_size << 2);
      this_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==(const vector& rhs) const
        {
            if (m_size != rhs.m_size)
            {
                return false;
            }
            else if (m_size)
            {
                if (scalar_type<T>::cFlag)
                {
                    return memcmp(m_p, rhs.m_p, sizeof(T) * m_size) == 0;
                }
                else
                {
                    const T* pSrc = m_p;
                    const T* pDst = rhs.m_p;
                    for (uint i = m_size; i; i--)
                    {
                        if (*pSrc++ != *pDst++)
                        {
                            return false;
                        }
                    }
                }
            }

            return true;
        }